

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

int tclpkcs11_listmechs(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  ProcErrorProc *pPVar1;
  Tcl_Interp *pTVar2;
  Tcl_Obj *pTVar3;
  Tcl_HashEntry *pTVar4;
  char *__ptr;
  char bufmech [256];
  Tcl_Obj *curr_item_list;
  CK_SLOT_ID slotid;
  CK_CHAR *name;
  uint lcv2;
  CK_ULONG MechanismCount;
  CK_MECHANISM_TYPE_PTR MechanismList;
  Tcl_HashTable *pTStack_60;
  int tcl_rv;
  long slotid_long;
  Tcl_Obj *tcl_slotid;
  Tcl_Obj *tcl_handle;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  Tcl_Obj **objv_local;
  Tcl_Interp *pTStack_20;
  int objc_local;
  Tcl_Interp *interp_local;
  ClientData cd_local;
  
  interpdata = (tclpkcs11_interpdata *)objv;
  objv_local._4_4_ = objc;
  pTStack_20 = interp;
  interp_local = (Tcl_Interp *)cd;
  if (cd == (ClientData)0x0) {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar3 = (*tclStubsPtr->tcl_NewStringObj)("invalid clientdata",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar3);
    cd_local._4_4_ = 1;
  }
  else if (objc == 3) {
    tcl_slotid = objv[1];
    slotid_long = (long)objv[2];
    handle = (tclpkcs11_handle *)cd;
    tcl_handle = (Tcl_Obj *)(**(code **)((long)cd + 0x40))(cd,tcl_slotid);
    pTVar2 = pTStack_20;
    if (tcl_handle == (Tcl_Obj *)0x0) {
      pPVar1 = tclStubsPtr->tcl_SetObjResult;
      pTVar3 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
      (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar3);
      cd_local._4_4_ = 1;
    }
    else {
      tcl_handle_entry = (Tcl_HashEntry *)tcl_handle->typePtr;
      if ((Tcl_ObjType *)tcl_handle_entry == (Tcl_ObjType *)0x0) {
        pPVar1 = tclStubsPtr->tcl_SetObjResult;
        pTVar3 = (*tclStubsPtr->tcl_NewStringObj)("invalid handle",-1);
        (*pPVar1)((Tcl_Interp_conflict *)pTVar2,pTVar3);
        cd_local._4_4_ = 1;
      }
      else {
        cd_local._4_4_ =
             (*tclStubsPtr->tcl_GetLongFromObj)
                       ((Tcl_Interp_conflict *)pTStack_20,(Tcl_Obj *)slotid_long,
                        (long *)&stack0xffffffffffffffa0);
        if (cd_local._4_4_ == 0) {
          pTVar4 = (*tcl_handle_entry->tablePtr->findProc)(pTStack_60,(char *)0x0);
          cd_local._4_4_ = (int)pTVar4;
          if (cd_local._4_4_ == 0) {
            __ptr = (char *)malloc(0);
            pTVar4 = (*tcl_handle_entry->tablePtr->findProc)(pTStack_60,__ptr);
            cd_local._4_4_ = (int)pTVar4;
            if (cd_local._4_4_ == 0) {
              pTVar3 = (*tclStubsPtr->tcl_NewObj)();
              free(__ptr);
              (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)pTStack_20,pTVar3);
              cd_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  else {
    pPVar1 = tclStubsPtr->tcl_SetObjResult;
    pTVar3 = (*tclStubsPtr->tcl_NewStringObj)
                       ("wrong # args: should be \"pki::pkcs11::mechanism handle slot \"",-1);
    (*pPVar1)((Tcl_Interp_conflict *)interp,pTVar3);
    cd_local._4_4_ = 1;
  }
  return cd_local._4_4_;
}

Assistant:

MODULE_SCOPE int tclpkcs11_listmechs(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  int tcl_rv;
  CK_MECHANISM_TYPE_PTR MechanismList = NULL;  // Head to Mechanism list
  CK_ULONG       MechanismCount = 0;  // Number of supported mechanisms
  unsigned int   lcv2;           // Loop Control Variables
  CK_CHAR *name;
  CK_SLOT_ID slotid;
  Tcl_Obj *curr_item_list;
  char bufmech[256];


  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 3) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::mechanism handle slot \"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;
  tcl_rv = handle->pkcs11->C_GetMechanismList(slotid, NULL, &MechanismCount);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  /* Allocate enough memory to store all the supported mechanisms */
  MechanismList = (CK_MECHANISM_TYPE_PTR) malloc(MechanismCount *sizeof(CK_MECHANISM_TYPE));

  /* This time get the mechanism list */
  tcl_rv = handle->pkcs11->C_GetMechanismList(slotid, MechanismList, &MechanismCount);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  /* For each Mechanism in the List */
  curr_item_list = Tcl_NewObj();
  for (lcv2 = 0; lcv2 < MechanismCount; lcv2++){
    /* Get the Mechanism Info and display it */
    name = (CK_CHAR *)get_mechanism_name(MechanismList[lcv2]);
    if (name) {
      sprintf((char *)bufmech, "%s (0x%lX)", name, MechanismList[lcv2]);
    } else {
      sprintf((char *)bufmech, "0x%lX (0x%lX)", MechanismList[lcv2], MechanismList[lcv2]);
    }
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj(bufmech, -1));
  }
  /* Free the memory we allocated for the mechanism list */
  free (MechanismList);

  Tcl_SetObjResult(interp, curr_item_list);
  return(TCL_OK);
}